

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Function * soul::StructuralParser::cloneFunction(Allocator *allocator,Function *functionToClone)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar2;
  pool_ref *this;
  Function *pFVar3;
  pool_ptr<soul::AST::ModuleBase> local_e8;
  size_type local_e0;
  size_type oldSize;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *local_c8;
  vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
  *functionList;
  StructuralParser p;
  ModuleBase *parentModule;
  Function *functionToClone_local;
  Allocator *allocator_local;
  
  iVar1 = (*(functionToClone->super_ASTObject)._vptr_ASTObject[3])();
  p.noop.object = (NoopStatement *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))();
  checkAssertion(p.noop.object != (NoopStatement *)0x0,"parentModule != nullptr","cloneFunction",
                 0x6c);
  *(undefined1 *)&p.noop.object[1].super_Statement.super_ASTObject.context.parentScope = 0;
  StructuralParser((StructuralParser *)&functionList,allocator,
                   &(functionToClone->super_ASTObject).context.location,(ModuleBase *)p.noop.object)
  ;
  iVar1 = (*((p.noop.object)->super_Statement).super_ASTObject._vptr_ASTObject[0xc])();
  local_c8 = (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
              *)CONCAT44(extraout_var_00,iVar1);
  checkAssertion(local_c8 !=
                 (vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
                  *)0x0,"functionList != nullptr","cloneFunction",0x71);
  local_e0 = std::
             vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
             ::size(local_c8);
  pool_ptr<soul::AST::ModuleBase>::pool_ptr<soul::AST::ModuleBase,void>
            (&local_e8,(ModuleBase *)p.noop.object);
  p.allocator = (Allocator *)local_e8.object;
  pool_ptr<soul::AST::ModuleBase>::~pool_ptr(&local_e8);
  parseFunctionOrStateVariable((StructuralParser *)&functionList);
  sVar2 = std::
          vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
          ::size(local_c8);
  checkAssertion(sVar2 == local_e0 + 1,"functionList->size() == oldSize + 1","cloneFunction",0x75);
  ignoreUnused<unsigned_long&>(&local_e0);
  this = (pool_ref *)
         std::
         vector<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
         ::back(local_c8);
  pFVar3 = pool_ref::operator_cast_to_Function_(this);
  ~StructuralParser((StructuralParser *)&functionList);
  return pFVar3;
}

Assistant:

static AST::Function& cloneFunction (AST::Allocator& allocator,
                                         const AST::Function& functionToClone)
    {
        auto parentModule = functionToClone.getParentScope()->getAsModule();
        SOUL_ASSERT (parentModule != nullptr);

        parentModule->isFullyResolved = false;
        StructuralParser p (allocator, functionToClone.context.location, *parentModule);
        auto functionList = parentModule->getFunctionList();
        SOUL_ASSERT (functionList != nullptr);
        auto oldSize = functionList->size();
        p.module = *parentModule;
        p.parseFunctionOrStateVariable();
        SOUL_ASSERT (functionList->size() == oldSize + 1);
        ignoreUnused (oldSize);
        return functionList->back();
    }